

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O3

opj_pi_iterator_t *
pi_initialise_encode(opj_image_t *image,opj_cp_t *cp,int tileno,J2K_T2_MODE t2_mode)

{
  uint uVar1;
  opj_pi_comp_t *poVar2;
  uint uVar3;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 OVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  opj_tcp_t *poVar11;
  opj_tccp_t *poVar12;
  opj_image_comp_t *poVar13;
  undefined4 uVar14;
  int iVar15;
  OPJ_UINT32 OVar16;
  opj_pi_iterator_t *pi;
  opj_pi_comp_t *poVar17;
  opj_pi_resolution_t *poVar18;
  short *psVar19;
  byte bVar20;
  byte bVar21;
  ulong uVar22;
  int iVar23;
  OPJ_UINT32 OVar24;
  OPJ_UINT32 OVar25;
  OPJ_UINT32 OVar26;
  long lVar27;
  long lVar28;
  uint uVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  OPJ_UINT32 OVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  uint uVar37;
  long lVar38;
  uint uVar39;
  int iVar40;
  ulong uVar41;
  OPJ_UINT32 local_f0;
  int local_ec;
  OPJ_UINT32 *local_78;
  
  poVar11 = cp->tcps;
  iVar15 = poVar11[tileno].numpocs;
  uVar1 = iVar15 + 1;
  pi = (opj_pi_iterator_t *)calloc((long)(int)uVar1,0xf8);
  if (pi == (opj_pi_iterator_t *)0x0) {
LAB_001fb709:
    pi = (opj_pi_iterator_t *)0x0;
  }
  else {
    pi->tp_on = cp->tp_on;
    if (-1 < iVar15) {
      iVar15 = tileno / cp->tw;
      iVar23 = tileno % cp->tw;
      OVar26 = cp->tdx * iVar23 + cp->tx0;
      if ((int)OVar26 <= (int)image->x0) {
        OVar26 = image->x0;
      }
      OVar33 = cp->tdy * iVar15 + cp->ty0;
      if ((int)OVar33 <= (int)image->y0) {
        OVar33 = image->y0;
      }
      OVar24 = (iVar23 + 1) * cp->tdx + cp->tx0;
      if ((int)image->x1 <= (int)OVar24) {
        OVar24 = image->x1;
      }
      OVar16 = (iVar15 + 1) * cp->tdy + cp->ty0;
      if ((int)image->y1 <= (int)OVar16) {
        OVar16 = image->y1;
      }
      uVar3 = image->numcomps;
      uVar41 = 0;
      local_f0 = 0;
      local_ec = 0;
      do {
        pi[uVar41].tx0 = OVar26;
        pi[uVar41].ty0 = OVar33;
        pi[uVar41].tx1 = OVar24;
        pi[uVar41].ty1 = OVar16;
        pi[uVar41].numcomps = uVar3;
        poVar17 = (opj_pi_comp_t *)calloc((ulong)uVar3,0x18);
        pi[uVar41].comps = poVar17;
        if (poVar17 == (opj_pi_comp_t *)0x0) {
LAB_001fb700:
          pi_destroy(pi,cp,tileno);
          goto LAB_001fb709;
        }
        if (0 < (int)uVar3) {
          poVar12 = poVar11[tileno].tccps;
          poVar13 = image->comps;
          local_78 = poVar12->prch;
          uVar22 = 0;
          do {
            OVar4 = poVar13[uVar22].dx;
            poVar17[uVar22].dx = OVar4;
            OVar5 = poVar13[uVar22].dy;
            poVar17[uVar22].dy = OVar5;
            OVar25 = poVar12[uVar22].numresolutions;
            lVar27 = (long)(int)OVar25;
            poVar17[uVar22].numresolutions = OVar25;
            poVar18 = (opj_pi_resolution_t *)malloc(lVar27 << 4);
            poVar17[uVar22].resolutions = poVar18;
            if (poVar18 == (opj_pi_resolution_t *)0x0) goto LAB_001fb700;
            if ((int)local_f0 < (int)OVar25) {
              local_f0 = OVar25;
            }
            if (0 < (int)OVar25) {
              uVar6 = poVar12[uVar22].csty;
              lVar28 = 0;
              do {
                OVar25 = OVar25 - 1;
                if ((uVar6 & 1) == 0) {
                  (&poVar18->pdx)[lVar28] = 0xf;
                  iVar15 = 0xf;
                  iVar23 = 0xf;
                }
                else {
                  iVar15 = *(int *)((long)local_78 + lVar28 + -0x84);
                  (&poVar18->pdx)[lVar28] = iVar15;
                  iVar23 = *(int *)((long)local_78 + lVar28);
                }
                bVar20 = (byte)OVar25;
                iVar35 = 1 << (bVar20 & 0x1f);
                uVar32 = (int)(OVar26 + OVar4 + -1) / (int)OVar4 + -1 + iVar35 >> (bVar20 & 0x1f);
                uVar31 = (int)(OVar33 + OVar5 + -1) / (int)OVar5 + -1 + iVar35 >> (bVar20 & 0x1f);
                uVar37 = (int)(OVar24 + OVar4 + -1) / (int)OVar4 + -1 + iVar35 >> (bVar20 & 0x1f);
                uVar36 = iVar35 + (int)(OVar16 + OVar5 + -1) / (int)OVar5 + -1 >> (bVar20 & 0x1f);
                bVar20 = (byte)iVar23;
                uVar29 = -1 << (bVar20 & 0x1f);
                bVar21 = (byte)iVar15;
                uVar39 = -1 << (bVar21 & 0x1f);
                iVar15 = (int)((((1 << (bVar21 & 0x1f)) + uVar37) - 1 & uVar39) - (uVar39 & uVar32))
                         >> (bVar21 & 0x1f);
                if (uVar32 == uVar37) {
                  iVar15 = 0;
                }
                iVar35 = (int)((((1 << (bVar20 & 0x1f)) + uVar36) - 1 & uVar29) - (uVar29 & uVar31))
                         >> (bVar20 & 0x1f);
                (&poVar18->pdy)[lVar28] = iVar23;
                (&poVar18->pw)[lVar28] = iVar15;
                if (uVar31 == uVar36) {
                  iVar35 = 0;
                }
                (&poVar18->ph)[lVar28] = iVar35;
                if (local_ec < iVar35 * iVar15) {
                  local_ec = iVar35 * iVar15;
                }
                lVar28 = lVar28 + 4;
              } while (lVar27 << 2 != lVar28);
            }
            uVar22 = uVar22 + 1;
            local_78 = local_78 + 0x10e;
          } while (uVar22 != uVar3);
        }
        pi[uVar41].step_p = 1;
        pi[uVar41].step_c = local_ec;
        pi[uVar41].step_r = uVar3 * local_ec;
        iVar23 = uVar3 * local_ec * local_f0;
        pi[uVar41].step_l = iVar23;
        iVar15 = pi->numcomps;
        if (0 < (long)iVar15) {
          poVar17 = pi->comps;
          lVar27 = 0;
          do {
            iVar35 = poVar17[lVar27].numresolutions;
            lVar28 = (long)iVar35;
            if (0 < lVar28) {
              poVar2 = poVar17 + lVar27;
              poVar18 = poVar2->resolutions;
              iVar7 = poVar2->dx;
              iVar8 = poVar2->dy;
              lVar38 = 0;
              do {
                iVar35 = iVar35 + -1;
                iVar30 = iVar7 << ((char)*(undefined4 *)((long)&poVar18->pdx + lVar38) +
                                   (char)iVar35 & 0x1fU);
                iVar40 = iVar8 << ((char)*(undefined4 *)((long)&poVar18->pdy + lVar38) +
                                   (char)iVar35 & 0x1fU);
                iVar9 = pi->dx;
                iVar34 = iVar30;
                if (iVar9 < iVar30) {
                  iVar34 = iVar9;
                }
                if (iVar9 == 0) {
                  iVar34 = iVar30;
                }
                pi[uVar41].dx = iVar34;
                iVar9 = pi->dy;
                iVar34 = iVar40;
                if (iVar9 < iVar40) {
                  iVar34 = iVar9;
                }
                if (iVar9 == 0) {
                  iVar34 = iVar40;
                }
                pi[uVar41].dy = iVar34;
                lVar38 = lVar38 + 0x10;
              } while (lVar28 * 0x10 != lVar38);
            }
            lVar27 = lVar27 + 1;
          } while (lVar27 != iVar15);
        }
        if (uVar41 == 0) {
          psVar19 = (short *)calloc((long)iVar23 * (long)poVar11[tileno].numlayers,2);
          pi->include = psVar19;
          if (psVar19 == (short *)0x0) goto LAB_001fb700;
        }
        else {
          pi[uVar41].include = pi[uVar41 - 1].include;
        }
        if ((poVar11[tileno].POC == 0) || ((t2_mode != FINAL_PASS && (cp->cinema == OFF)))) {
          poVar11[tileno].pocs[uVar41].compS = 0;
          poVar11[tileno].pocs[uVar41].compE = uVar3;
          poVar11[tileno].pocs[uVar41].resE = local_f0;
          poVar11[tileno].pocs[uVar41].layS = 0;
          poVar11[tileno].pocs[uVar41].resS = 0;
          poVar11[tileno].pocs[uVar41].layE = poVar11[tileno].numlayers;
          poVar11[tileno].pocs[uVar41].prg = poVar11[tileno].prg;
        }
        else {
          poVar11[tileno].pocs[uVar41].compE = poVar11[tileno].pocs[uVar41].compno1;
          OVar4 = poVar11[tileno].pocs[uVar41].compno0;
          uVar10 = poVar11[tileno].pocs[uVar41].layno1;
          uVar14 = poVar11[tileno].pocs[uVar41].resno1;
          poVar11[tileno].pocs[uVar41].resS = poVar11[tileno].pocs[uVar41].resno0;
          poVar11[tileno].pocs[uVar41].compS = OVar4;
          poVar11[tileno].pocs[uVar41].layE = uVar10;
          poVar11[tileno].pocs[uVar41].resE = uVar14;
          poVar11[tileno].pocs[uVar41].prg = poVar11[tileno].pocs[uVar41].prg1;
          if (uVar41 != 0) {
            iVar15 = poVar11[tileno].pocs[uVar41 - 1].layE;
            if ((int)uVar10 <= iVar15) {
              iVar15 = 0;
            }
            poVar11[tileno].pocs[uVar41].layS = iVar15;
          }
        }
        poVar11[tileno].pocs[uVar41].prcS = 0;
        poVar11[tileno].pocs[uVar41].prcE = local_ec;
        poVar11[tileno].pocs[uVar41].txS = OVar26;
        poVar11[tileno].pocs[uVar41].txE = OVar24;
        poVar11[tileno].pocs[uVar41].tyS = OVar33;
        poVar11[tileno].pocs[uVar41].tyE = OVar16;
        iVar15 = pi[uVar41].dy;
        poVar11[tileno].pocs[uVar41].dx = pi[uVar41].dx;
        poVar11[tileno].pocs[uVar41].dy = iVar15;
        uVar41 = uVar41 + 1;
      } while (uVar41 != uVar1);
    }
  }
  return pi;
}

Assistant:

opj_pi_iterator_t *pi_initialise_encode(opj_image_t *image, opj_cp_t *cp, int tileno, J2K_T2_MODE t2_mode){ 
	int p, q, pino;
	int compno, resno;
	int maxres = 0;
	int maxprec = 0;
	opj_pi_iterator_t *pi = NULL;
	opj_tcp_t *tcp = NULL;
	opj_tccp_t *tccp = NULL;
	
	tcp = &cp->tcps[tileno];

	pi = (opj_pi_iterator_t*) opj_calloc((tcp->numpocs + 1), sizeof(opj_pi_iterator_t));
	if(!pi) {	return NULL;}
	pi->tp_on = cp->tp_on;

	for(pino = 0;pino < tcp->numpocs+1 ; pino ++){
		p = tileno % cp->tw;
		q = tileno / cp->tw;

		pi[pino].tx0 = int_max(cp->tx0 + p * cp->tdx, image->x0);
		pi[pino].ty0 = int_max(cp->ty0 + q * cp->tdy, image->y0);
		pi[pino].tx1 = int_min(cp->tx0 + (p + 1) * cp->tdx, image->x1);
		pi[pino].ty1 = int_min(cp->ty0 + (q + 1) * cp->tdy, image->y1);
		pi[pino].numcomps = image->numcomps;
		
		pi[pino].comps = (opj_pi_comp_t*) opj_calloc(image->numcomps, sizeof(opj_pi_comp_t));
		if(!pi[pino].comps) {
			pi_destroy(pi, cp, tileno);
			return NULL;
		}
		
		for (compno = 0; compno < pi[pino].numcomps; compno++) {
			int tcx0, tcy0, tcx1, tcy1;
			opj_pi_comp_t *comp = &pi[pino].comps[compno];
			tccp = &tcp->tccps[compno];
			comp->dx = image->comps[compno].dx;
			comp->dy = image->comps[compno].dy;
			comp->numresolutions = tccp->numresolutions;

			comp->resolutions = (opj_pi_resolution_t*) opj_malloc(comp->numresolutions * sizeof(opj_pi_resolution_t));
			if(!comp->resolutions) {
				pi_destroy(pi, cp, tileno);
				return NULL;
			}

			tcx0 = int_ceildiv(pi[pino].tx0, comp->dx);
			tcy0 = int_ceildiv(pi[pino].ty0, comp->dy);
			tcx1 = int_ceildiv(pi[pino].tx1, comp->dx);
			tcy1 = int_ceildiv(pi[pino].ty1, comp->dy);
			if (comp->numresolutions > maxres) {
				maxres = comp->numresolutions;
			}

			for (resno = 0; resno < comp->numresolutions; resno++) {
				int levelno;
				int rx0, ry0, rx1, ry1;
				int px0, py0, px1, py1;
				opj_pi_resolution_t *res = &comp->resolutions[resno];
				if (tccp->csty & J2K_CCP_CSTY_PRT) {
					res->pdx = tccp->prcw[resno];
					res->pdy = tccp->prch[resno];
				} else {
					res->pdx = 15;
					res->pdy = 15;
				}
				levelno = comp->numresolutions - 1 - resno;
				rx0 = int_ceildivpow2(tcx0, levelno);
				ry0 = int_ceildivpow2(tcy0, levelno);
				rx1 = int_ceildivpow2(tcx1, levelno);
				ry1 = int_ceildivpow2(tcy1, levelno);
				px0 = int_floordivpow2(rx0, res->pdx) << res->pdx;
				py0 = int_floordivpow2(ry0, res->pdy) << res->pdy;
				px1 = int_ceildivpow2(rx1, res->pdx) << res->pdx;
				py1 = int_ceildivpow2(ry1, res->pdy) << res->pdy;
				res->pw = (rx0==rx1)?0:((px1 - px0) >> res->pdx);
				res->ph = (ry0==ry1)?0:((py1 - py0) >> res->pdy);

				if (res->pw*res->ph > maxprec) {
					maxprec = res->pw * res->ph;
				}
			}
		}
		
		tccp = &tcp->tccps[0];
		pi[pino].step_p = 1;
		pi[pino].step_c = maxprec * pi[pino].step_p;
		pi[pino].step_r = image->numcomps * pi[pino].step_c;
		pi[pino].step_l = maxres * pi[pino].step_r;
		
		for (compno = 0; compno < pi->numcomps; compno++) {
			opj_pi_comp_t *comp = &pi->comps[compno];
			for (resno = 0; resno < comp->numresolutions; resno++) {
				int dx, dy;
				opj_pi_resolution_t *res = &comp->resolutions[resno];
				dx = comp->dx * (1 << (res->pdx + comp->numresolutions - 1 - resno));
				dy = comp->dy * (1 << (res->pdy + comp->numresolutions - 1 - resno));
				pi[pino].dx = !pi->dx ? dx : int_min(pi->dx, dx);
				pi[pino].dy = !pi->dy ? dy : int_min(pi->dy, dy);
			}
		}

		if (pino == 0) {
			pi[pino].include = (short int*) opj_calloc(tcp->numlayers * pi[pino].step_l, sizeof(short int));
			if(!pi[pino].include) {
				pi_destroy(pi, cp, tileno);
				return NULL;
			}
		}
		else {
			pi[pino].include = pi[pino - 1].include;
		}
		
		/* Generation of boundaries for each prog flag*/
			if(tcp->POC && ( cp->cinema || ((!cp->cinema) && (t2_mode == FINAL_PASS)))){
				tcp->pocs[pino].compS= tcp->pocs[pino].compno0;
				tcp->pocs[pino].compE= tcp->pocs[pino].compno1;
				tcp->pocs[pino].resS = tcp->pocs[pino].resno0;
				tcp->pocs[pino].resE = tcp->pocs[pino].resno1;
				tcp->pocs[pino].layE = tcp->pocs[pino].layno1;
				tcp->pocs[pino].prg  = tcp->pocs[pino].prg1;
				if (pino > 0)
					tcp->pocs[pino].layS = (tcp->pocs[pino].layE > tcp->pocs[pino - 1].layE) ? tcp->pocs[pino - 1].layE : 0;
			}else {
				tcp->pocs[pino].compS= 0;
				tcp->pocs[pino].compE= image->numcomps;
				tcp->pocs[pino].resS = 0;
				tcp->pocs[pino].resE = maxres;
				tcp->pocs[pino].layS = 0;
				tcp->pocs[pino].layE = tcp->numlayers;
				tcp->pocs[pino].prg  = tcp->prg;
			}
			tcp->pocs[pino].prcS = 0;
			tcp->pocs[pino].prcE = maxprec;;
			tcp->pocs[pino].txS = pi[pino].tx0;
			tcp->pocs[pino].txE = pi[pino].tx1;
			tcp->pocs[pino].tyS = pi[pino].ty0;
			tcp->pocs[pino].tyE = pi[pino].ty1;
			tcp->pocs[pino].dx = pi[pino].dx;
			tcp->pocs[pino].dy = pi[pino].dy;
		}
			return pi;
	}